

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O3

int32 dumbfile_getnc(char *ptr,int32 n,DUMBFILE *f)

{
  _func_int32_char_ptr_int32_void_ptr *p_Var1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (f->pos < 0) {
    uVar5 = 0xffffffff;
  }
  else {
    uVar4 = (ulong)(uint)n;
    p_Var1 = f->dfs->getnc;
    if (p_Var1 == (_func_int32_char_ptr_int32_void_ptr *)0x0) {
      if (n < 1) {
        uVar4 = 0;
      }
      else {
        uVar5 = 0;
        do {
          iVar3 = (*f->dfs->getc)(f->file);
          if (iVar3 < 0) {
            f->pos = -1;
            goto LAB_0070766c;
          }
          ptr[uVar5] = (char)iVar3;
          uVar5 = uVar5 + 1;
        } while (n != (int)uVar5);
      }
    }
    else {
      uVar2 = (*p_Var1)(ptr,n,f->file);
      uVar4 = (ulong)uVar2;
      if ((int)uVar2 < n) {
        f->pos = -1;
        if ((int)uVar2 < 1) {
          return 0;
        }
        return uVar2;
      }
    }
    f->pos = f->pos + (long)(int)uVar4;
    uVar5 = uVar4;
  }
LAB_0070766c:
  return (int32)uVar5;
}

Assistant:

int32 DUMBEXPORT dumbfile_getnc(char *ptr, int32 n, DUMBFILE *f)
{
	int32 rv;

	ASSERT(f);
	ASSERT(n >= 0);

	if (f->pos < 0)
		return -1;

	if (f->dfs->getnc) {
		rv = (*f->dfs->getnc)(ptr, n, f->file);
		if (rv < n) {
			f->pos = -1;
			return MAX(rv, 0);
		}
	} else {
		for (rv = 0; rv < n; rv++) {
			int c = (*f->dfs->getc)(f->file);
			if (c < 0) {
				f->pos = -1;
				return rv;
			}
			*ptr++ = c;
		}
	}

	f->pos += rv;

	return rv;
}